

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_test.cc
# Opt level: O1

int MT_basic_insert_test(void)

{
  undefined8 *puVar1;
  LatencyCollector *pLVar2;
  long lVar3;
  long lVar4;
  vector<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_> t_hdl;
  LatencyDumpDefaultImpl default_dump;
  vector<test_args,_std::allocator<test_args>_> args;
  LatencyCollector lat;
  vector<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_> local_138;
  string local_118;
  code *local_f8 [2];
  code *local_e8;
  code *pcStack_e0;
  LatencyDump local_d8;
  LatencyCollectorDumpOptions local_d0;
  _Any_data local_c8;
  code *local_b8;
  undefined8 uStack_b0;
  vector<test_args,_std::allocator<test_args>_> local_a0;
  LatencyCollector local_88;
  
  pLVar2 = (LatencyCollector *)operator_new(0x58);
  LatencyCollector::LatencyCollector(pLVar2);
  global_lat = pLVar2;
  LatencyCollector::LatencyCollector(&local_88);
  local_138.super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x2c0);
  local_138.super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_138.
       super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>._M_impl
       .super__Vector_impl_data._M_start + 8;
  lVar3 = 0;
  do {
    puVar1 = (undefined8 *)
             ((long)&((local_138.
                       super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>
                       ._M_impl.super__Vector_impl_data._M_start)->args).func.super__Function_base.
                     _M_manager + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&((local_138.
                       super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>
                       ._M_impl.super__Vector_impl_data._M_start)->args).func.super__Function_base.
                     _M_functor + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&((local_138.
                       super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>
                       ._M_impl.super__Vector_impl_data._M_start)->handler)._M_invoker + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&((local_138.
                       super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>
                       ._M_impl.super__Vector_impl_data._M_start)->handler).super__Function_base.
                     _M_functor + lVar3 + 8);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&(local_138.
                      super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>
                      ._M_impl.super__Vector_impl_data._M_start)->tid + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)
     ((long)&((local_138.
               super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>
               ._M_impl.super__Vector_impl_data._M_start)->args).rc + lVar3) = 0;
    lVar3 = lVar3 + 0x58;
  } while (lVar3 != 0x2c0);
  local_138.super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_138.
       super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>._M_impl
       .super__Vector_impl_data._M_start + 8;
  std::vector<test_args,_std::allocator<test_args>_>::vector
            (&local_a0,8,(allocator_type *)&local_118);
  lVar3 = 0;
  lVar4 = 0;
  do {
    *(LatencyCollector **)
     ((long)&(local_a0.super__Vector_base<test_args,_std::allocator<test_args>_>._M_impl.
              super__Vector_impl_data._M_start)->lat + lVar3) = &local_88;
    local_f8[1] = (code *)0x0;
    local_f8[0] = insert_thread;
    pcStack_e0 = std::
                 _Function_handler<int_(TestSuite::ThreadArgs_*),_int_(*)(TestSuite::ThreadArgs_*)>
                 ::_M_invoke;
    local_e8 = std::
               _Function_handler<int_(TestSuite::ThreadArgs_*),_int_(*)(TestSuite::ThreadArgs_*)>::
               _M_manager;
    local_c8._M_unused._M_object = (void *)0x0;
    local_c8._8_8_ = 0;
    local_b8 = (code *)0x0;
    uStack_b0 = 0;
    TestSuite::ThreadHolder::spawn
              ((ThreadHolder *)
               ((long)&(local_138.
                        super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>
                        ._M_impl.super__Vector_impl_data._M_start)->tid + lVar4),
               (ThreadArgs *)
               ((long)&(local_a0.super__Vector_base<test_args,_std::allocator<test_args>_>._M_impl.
                        super__Vector_impl_data._M_start)->lat + lVar3),(ThreadFunc *)local_f8,
               (ThreadExitHandler *)&local_c8);
    if (local_b8 != (code *)0x0) {
      (*local_b8)(&local_c8,&local_c8,__destroy_functor);
    }
    if (local_e8 != (code *)0x0) {
      (*local_e8)((_Any_data *)local_f8,(_Any_data *)local_f8,__destroy_functor);
    }
    lVar4 = lVar4 + 0x58;
    lVar3 = lVar3 + 8;
  } while (lVar4 != 0x2c0);
  lVar3 = 0;
  do {
    TestSuite::ThreadHolder::join
              ((ThreadHolder *)
               ((long)&(local_138.
                        super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>
                        ._M_impl.super__Vector_impl_data._M_start)->tid + lVar3),false);
    lVar3 = lVar3 + 0x58;
  } while (lVar3 != 0x2c0);
  local_d8._vptr_LatencyDump = (_func_int **)&PTR_dump_abi_cxx11__0010ecd8;
  local_d0.sort_by = NAME;
  local_d0.view_type = TREE;
  LatencyCollector::dump_abi_cxx11_(&local_118,&local_88,&local_d8,&local_d0);
  if (((TestSuite::getCurTest()::cur_test != (char *)0x0) &&
      (((*TestSuite::getCurTest()::cur_test != '\0' ||
        (TestSuite::getCurTest()::cur_test[0x3c] == '\x01')) &&
       (TestSuite::getCurTest()::cur_test[0x3b] != '\x01')))) ||
     (TestSuite::globalMsgFlag()::global_msg_flag == '\x01')) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_118._M_dataplus._M_p,local_118._M_string_length);
  }
  if ((((TestSuite::getCurTest()::cur_test != (char *)0x0) &&
       ((*TestSuite::getCurTest()::cur_test != '\0' ||
        (TestSuite::getCurTest()::cur_test[0x3c] == '\x01')))) &&
      (TestSuite::getCurTest()::cur_test[0x3b] != '\x01')) ||
     (TestSuite::globalMsgFlag()::global_msg_flag == '\x01')) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  local_d0.sort_by = NAME;
  local_d0.view_type = TREE;
  LatencyCollector::dump_abi_cxx11_(&local_118,global_lat,&local_d8,&local_d0);
  if ((((TestSuite::getCurTest()::cur_test != (char *)0x0) &&
       ((*TestSuite::getCurTest()::cur_test != '\0' ||
        (TestSuite::getCurTest()::cur_test[0x3c] == '\x01')))) &&
      (TestSuite::getCurTest()::cur_test[0x3b] != '\x01')) ||
     (TestSuite::globalMsgFlag()::global_msg_flag == '\x01')) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_118._M_dataplus._M_p,local_118._M_string_length);
  }
  if (((TestSuite::getCurTest()::cur_test != (char *)0x0) &&
      (((*TestSuite::getCurTest()::cur_test != '\0' ||
        (TestSuite::getCurTest()::cur_test[0x3c] == '\x01')) &&
       (TestSuite::getCurTest()::cur_test[0x3b] != '\x01')))) ||
     (TestSuite::globalMsgFlag()::global_msg_flag == '\x01')) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  pLVar2 = global_lat;
  if (global_lat != (LatencyCollector *)0x0) {
    LatencyCollector::~LatencyCollector(global_lat);
    operator_delete(pLVar2);
  }
  global_lat = (LatencyCollector *)0x0;
  if (local_a0.super__Vector_base<test_args,_std::allocator<test_args>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<test_args,_std::allocator<test_args>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>::~vector
            (&local_138);
  LatencyCollector::~LatencyCollector(&local_88);
  return 0;
}

Assistant:

int MT_basic_insert_test() {
    global_lat = new LatencyCollector();

    size_t i;
    size_t n_threads = 8;

    LatencyCollector lat;

    std::vector<TestSuite::ThreadHolder> t_hdl(n_threads);
    std::vector<test_args> args(n_threads);
    for (i=0; i<n_threads; ++i) {
        args[i].lat = &lat;
        t_hdl[i].spawn(&args[i], insert_thread, nullptr);
    }

    for (i=0; i<n_threads; ++i){
        t_hdl[i].join();
    }

    LatencyDumpDefaultImpl default_dump;
    TestSuite::Msg msg_stream;
    msg_stream << lat.dump(&default_dump) << std::endl;
    msg_stream << global_lat->dump(&default_dump) << std::endl;

    delete global_lat;
    global_lat = nullptr;

    return 0;
}